

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O2

void Psr_ManRemapBoxes(Bac_Man_t *pNew,Vec_Ptr_t *vDes,Psr_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  char *pStr;
  Psr_Ntk_t *pNtkBox;
  int i;
  
  i = 0;
  do {
    if ((pNtk->vObjs).nSize <= i) {
      return;
    }
    Psr_BoxSignals(pNtk,i);
    iVar1 = Psr_BoxIsNode(pNtk,i);
    if (iVar1 == 0) {
      iVar1 = Psr_BoxNtk(pNtk,i);
      pStr = Psr_NtkStr(pNtk,iVar1);
      iVar1 = Abc_NamStrFind(pNew->pMods,pStr);
      if (iVar1 < 1) {
        __assert_fail("NtkIdNew > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                      ,0x88,
                      "void Psr_ManRemapBoxes(Bac_Man_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *)");
      }
      iVar2 = Vec_IntEntry(&pNtk->vObjs,i);
      Vec_IntWriteEntry(&pNtk->vBoxes,iVar2 + 1,iVar1);
      if (iVar1 <= pNew->nNtks) {
        pNtkBox = Psr_ManNtk(vDes,iVar1 + -1);
        Psr_ManRemapOne(&Psr_BoxSignals::V,pNtkBox,vMap);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Psr_ManRemapBoxes( Bac_Man_t * pNew, Vec_Ptr_t * vDes, Psr_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Vec_Int_t * vSigs; int iBox;
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            int NtkId = Psr_BoxNtk( pNtk, iBox );
            int NtkIdNew = Bac_ManNtkFindId( pNew, Psr_NtkStr(pNtk, NtkId) );
            assert( NtkIdNew > 0 );
            Psr_BoxSetNtk( pNtk, iBox, NtkIdNew );
            if ( NtkIdNew <= Bac_ManNtkNum(pNew) )
                Psr_ManRemapOne( vSigs, Psr_ManNtk(vDes, NtkIdNew-1), vMap );
            //else
            //    Psr_ManRemapGate( vSigs );
        }
}